

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dispatch.cpp
# Opt level: O2

cl_int clEnqueueMigrateMemINTEL
                 (cl_command_queue queue,void *ptr,size_t size,cl_mem_migration_flags flags,
                 cl_uint num_events_in_wait_list,cl_event *event_wait_list,cl_event *event)

{
  CTracker *pCVar1;
  CLIntercept *this;
  uint64_t uVar2;
  bool bVar3;
  byte bVar4;
  cl_int errorCode;
  cl_int errorCode_00;
  CLdispatchX *pCVar5;
  time_point tVar6;
  time_point tVar7;
  cl_command_queue p_Var8;
  bool bVar9;
  allocator local_b1;
  uint64_t local_b0;
  time_point local_a8;
  cl_command_queue local_a0;
  string local_98;
  string eventWaitListString;
  time_point local_58;
  time_point local_50;
  cl_event local_event;
  
  this = g_pIntercept;
  if (g_pIntercept == (CLIntercept *)0x0) {
    return -0x24;
  }
  local_a8.__d.__r = (duration)(duration)size;
  local_a0 = queue;
  pCVar5 = CLIntercept::dispatchX(g_pIntercept,queue);
  if (pCVar5->clEnqueueMigrateMemINTEL ==
      (_func_cl_int_cl_command_queue_void_ptr_size_t_cl_mem_migration_flags_cl_uint_cl_event_ptr_cl_event_ptr
       *)0x0) {
    return -0x24;
  }
  local_b0 = CLIntercept::incrementEnqueueCounter(this);
  if (((((this->m_Config).AubCapture == true) && ((this->m_Config).AubCaptureMinEnqueue <= local_b0)
       ) && (local_b0 <= (this->m_Config).AubCaptureMaxEnqueue)) &&
     ((this->m_Config).AubCaptureIndividualEnqueues == false)) {
    CLIntercept::startAubCapture
              (this,"clEnqueueMigrateMemINTEL",local_b0,(cl_kernel)0x0,0,(size_t *)0x0,(size_t *)0x0
               ,local_a0);
  }
  errorCode = 0;
  if ((this->m_Config).NullEnqueue != false) goto LAB_00137919;
  getFormattedEventWaitList_abi_cxx11_
            (&eventWaitListString,this,num_events_in_wait_list,event_wait_list);
  if ((this->m_Config).CallLogging == true) {
    CEnumNameMap::name_mem_migration_flags_abi_cxx11_(&local_98,&this->m_EnumNameMap,flags);
    CLIntercept::callLoggingEnter
              (this,"clEnqueueMigrateMemINTEL",local_b0,(cl_kernel)0x0,
               "queue = %p, ptr = %p, size = %zu, flags = %s (%llX)%s",local_a0,ptr,local_a8.__d.__r
               ,local_98._M_dataplus._M_p,flags,eventWaitListString._M_dataplus._M_p);
    std::__cxx11::string::~string((string *)&local_98);
  }
  if ((this->m_Config).EventChecking == true) {
    CLIntercept::checkEventList
              (this,"clEnqueueMigrateMemINTEL",num_events_in_wait_list,event_wait_list,event);
  }
  local_event = (cl_event)0x0;
  if ((((this->m_Config).DevicePerformanceTiming == false) &&
      ((this->m_Config).ITTPerformanceTiming == false)) &&
     (((this->m_Config).ChromePerformanceTiming == false &&
      ((this->m_Config).DevicePerfCounterEventBasedSampling != true)))) {
    local_50.__d.__r = (duration)0;
    bVar9 = false;
  }
  else {
    local_50.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
    bVar9 = event == (cl_event *)0x0;
    if (bVar9) {
      event = &local_event;
    }
  }
  if (((this->m_Config).HostPerformanceTiming == false) &&
     ((this->m_Config).ChromeCallLogging != true)) {
    local_58.__d.__r = (duration)0;
  }
  else {
    local_58.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
  }
  p_Var8 = local_a0;
  errorCode = (*pCVar5->clEnqueueMigrateMemINTEL)
                        (local_a0,ptr,(size_t)local_a8.__d.__r,flags,num_events_in_wait_list,
                         event_wait_list,event);
  uVar2 = local_b0;
  if (((this->m_Config).HostPerformanceTiming == false) &&
     ((this->m_Config).ChromeCallLogging != true)) {
    local_a8.__d.__r = (duration)0;
  }
  else {
    local_a8.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
    if (((this->m_Config).HostPerformanceTiming == true) &&
       (((this->m_Config).HostPerformanceTimingMinEnqueue <= uVar2 &&
        (uVar2 <= (this->m_Config).HostPerformanceTimingMaxEnqueue)))) {
      std::__cxx11::string::string((string *)&local_98,"",&local_b1);
      CLIntercept::updateHostTimingStats
                (this,"clEnqueueMigrateMemINTEL",&local_98,local_58,local_a8);
      std::__cxx11::string::~string((string *)&local_98);
    }
  }
  if ((((this->m_Config).DevicePerformanceTiming == false) &&
      ((this->m_Config).ITTPerformanceTiming == false)) &&
     ((this->m_Config).ChromePerformanceTiming == false)) {
    if ((event != (cl_event *)0x0) &&
       ((this->m_Config).DevicePerfCounterEventBasedSampling != false)) {
LAB_00137729:
      if (((this->m_Config).DevicePerformanceTimingMinEnqueue <= uVar2) &&
         (uVar2 <= (this->m_Config).DevicePerformanceTimingMaxEnqueue)) {
        if ((this->m_Config).DevicePerformanceTimingSkipUnmap == true) {
          std::__cxx11::string::string((string *)&local_98,"clEnqueueMigrateMemINTEL",&local_b1);
          bVar3 = std::operator!=(&local_98,"clEnqueueUnmapMemObject");
          std::__cxx11::string::~string((string *)&local_98);
          if (!bVar3) goto LAB_001377d4;
        }
        std::__cxx11::string::string((string *)&local_98,"",&local_b1);
        CLIntercept::addTimingEvent
                  (this,"clEnqueueMigrateMemINTEL",uVar2,local_50,&local_98,p_Var8,*event);
        std::__cxx11::string::~string((string *)&local_98);
      }
LAB_001377d4:
      if (bVar9) {
        (*(this->m_Dispatch).clReleaseEvent)(*event);
        goto LAB_001377e9;
      }
    }
  }
  else {
    if (event != (cl_event *)0x0) goto LAB_00137729;
LAB_001377e9:
    event = (cl_event *)0x0;
  }
  if ((this->m_Config).ErrorLogging == false) {
    bVar4 = (this->m_Config).ErrorAssert;
    if ((bool)bVar4 == false) {
      if ((errorCode == 0) || ((this->m_Config).NoErrors == false)) goto LAB_0013784e;
    }
    else if (errorCode == 0) goto LAB_00137823;
LAB_00137835:
    if ((bVar4 & 1) != 0) {
      raise(5);
    }
    if ((this->m_Config).NoErrors != false) {
      errorCode = 0;
    }
  }
  else {
    if (errorCode != 0) {
      CLIntercept::logError(this,"clEnqueueMigrateMemINTEL",errorCode);
      bVar4 = (this->m_Config).ErrorAssert;
      goto LAB_00137835;
    }
LAB_00137823:
    errorCode = 0;
  }
LAB_0013784e:
  if (((event != (cl_event *)0x0) && ((this->m_Config).LeakChecking != false)) &&
     (*event != (cl_event)0x0)) {
    LOCK();
    pCVar1 = &(this->m_ObjectTracker).m_Events;
    (pCVar1->NumAllocations).super___atomic_base<unsigned_long>._M_i =
         (pCVar1->NumAllocations).super___atomic_base<unsigned_long>._M_i + 1;
    UNLOCK();
  }
  if ((this->m_Config).CallLogging == true) {
    CLIntercept::callLoggingExit
              (this,"clEnqueueMigrateMemINTEL",errorCode,event,(cl_sync_point_khr *)0x0);
  }
  if ((this->m_Config).ChromeCallLogging == true) {
    std::__cxx11::string::string((string *)&local_98,"",&local_b1);
    CLIntercept::chromeCallLoggingExit
              (this,"clEnqueueMigrateMemINTEL",&local_98,true,uVar2,local_58,local_a8);
    std::__cxx11::string::~string((string *)&local_98);
  }
  if (((event != (cl_event *)0x0) && (*event != (cl_event)0x0)) &&
     (((this->m_Config).ChromeCallLogging != false ||
      ((this->m_Config).ChromePerformanceTiming == true)))) {
    CLIntercept::addEvent(this,*event,uVar2);
  }
  std::__cxx11::string::~string((string *)&eventWaitListString);
LAB_00137919:
  p_Var8 = local_a0;
  uVar2 = local_b0;
  if ((this->m_Config).FinishAfterEnqueue == true) {
    if (((this->m_Config).ToolOverheadTiming == true) &&
       (((this->m_Config).HostPerformanceTiming != false ||
        ((this->m_Config).ChromeCallLogging == true)))) {
      tVar6.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
    }
    else {
      tVar6.__d.__r = (duration)0;
    }
    CLIntercept::logFlushOrFinishAfterEnqueueStart(this,"clFinish","clEnqueueMigrateMemINTEL");
    errorCode_00 = (*(this->m_Dispatch).clFinish)(local_a0);
    CLIntercept::logFlushOrFinishAfterEnqueueEnd
              (this,"clFinish","clEnqueueMigrateMemINTEL",errorCode_00);
    if (((this->m_Config).ToolOverheadTiming == true) &&
       (((this->m_Config).HostPerformanceTiming != false ||
        ((this->m_Config).ChromeCallLogging == true)))) {
      tVar7.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
      if (((this->m_Config).HostPerformanceTiming == true) &&
         (((this->m_Config).HostPerformanceTimingMinEnqueue <= uVar2 &&
          (uVar2 <= (this->m_Config).HostPerformanceTimingMaxEnqueue)))) {
        std::__cxx11::string::string((string *)&eventWaitListString,"",(allocator *)&local_98);
        CLIntercept::updateHostTimingStats
                  (this,"(finish after enqueue)",&eventWaitListString,tVar6,tVar7);
        std::__cxx11::string::~string((string *)&eventWaitListString);
      }
      if ((this->m_Config).ChromeCallLogging == true) {
        std::__cxx11::string::string((string *)&eventWaitListString,"",(allocator *)&local_98);
        CLIntercept::chromeCallLoggingExit
                  (this,"(finish after enqueue)",&eventWaitListString,false,0,tVar6,tVar7);
        std::__cxx11::string::~string((string *)&eventWaitListString);
      }
    }
    p_Var8 = local_a0;
    if (((this->m_Config).ToolOverheadTiming == true) &&
       (((this->m_Config).HostPerformanceTiming != false ||
        ((this->m_Config).ChromeCallLogging == true)))) {
      tVar6.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
    }
    else {
      tVar6.__d.__r = (duration)0;
    }
    CLIntercept::checkTimingEvents(this);
    if (((this->m_Config).ToolOverheadTiming == true) &&
       (((this->m_Config).HostPerformanceTiming != false ||
        ((this->m_Config).ChromeCallLogging == true)))) {
      tVar7.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
      if (((this->m_Config).HostPerformanceTiming == true) &&
         (((this->m_Config).HostPerformanceTimingMinEnqueue <= uVar2 &&
          (uVar2 <= (this->m_Config).HostPerformanceTimingMaxEnqueue)))) {
        std::__cxx11::string::string((string *)&eventWaitListString,"",(allocator *)&local_98);
        CLIntercept::updateHostTimingStats
                  (this,"(device timing overhead)",&eventWaitListString,tVar6,tVar7);
        std::__cxx11::string::~string((string *)&eventWaitListString);
      }
      if ((this->m_Config).ChromeCallLogging == true) {
        std::__cxx11::string::string((string *)&eventWaitListString,"",(allocator *)&local_98);
        CLIntercept::chromeCallLoggingExit
                  (this,"(device timing overhead)",&eventWaitListString,false,0,tVar6,tVar7);
        std::__cxx11::string::~string((string *)&eventWaitListString);
      }
    }
  }
  else if ((this->m_Config).FlushAfterEnqueue == true) {
    (*(this->m_Dispatch).clFlush)(local_a0);
  }
  if (((this->m_Config).AubCapture == true) &&
     ((((this->m_Config).AubCaptureIndividualEnqueues != false ||
       (uVar2 < (this->m_Config).AubCaptureMinEnqueue)) ||
      ((this->m_Config).AubCaptureMaxEnqueue < uVar2)))) {
    CLIntercept::stopAubCapture(this,p_Var8);
  }
  return errorCode;
}

Assistant:

CL_API_ENTRY cl_int CL_API_CALL clEnqueueMigrateMemINTEL(
    cl_command_queue queue,
    const void* ptr,
    size_t size,
    cl_mem_migration_flags flags,
    cl_uint num_events_in_wait_list,
    const cl_event* event_wait_list,
    cl_event* event)
{
    CLIntercept*    pIntercept = GetIntercept();

    if( pIntercept )
    {
        const auto& dispatchX = pIntercept->dispatchX(queue);
        if( dispatchX.clEnqueueMigrateMemINTEL )
        {
            cl_int  retVal = CL_SUCCESS;

            INCREMENT_ENQUEUE_COUNTER();
            CHECK_AUBCAPTURE_START( queue );

            if( pIntercept->config().NullEnqueue == false )
            {
                const std::string eventWaitListString = getFormattedEventWaitList(
                    pIntercept,
                    num_events_in_wait_list,
                    event_wait_list);

                CALL_LOGGING_ENTER( "queue = %p, ptr = %p, size = %zu, flags = %s (%llX)%s",
                    queue,
                    ptr,
                    size,
                    pIntercept->enumName().name_mem_migration_flags( flags ).c_str(),
                    flags,
                    eventWaitListString.c_str() );
                CHECK_EVENT_LIST( num_events_in_wait_list, event_wait_list, event );
                DEVICE_PERFORMANCE_TIMING_START( event );
                HOST_PERFORMANCE_TIMING_START();

                retVal = dispatchX.clEnqueueMigrateMemINTEL(
                    queue,
                    ptr,
                    size,
                    flags,
                    num_events_in_wait_list,
                    event_wait_list,
                    event );

                HOST_PERFORMANCE_TIMING_END();
                DEVICE_PERFORMANCE_TIMING_END( queue, event );
                CHECK_ERROR( retVal );
                ADD_OBJECT_ALLOCATION( event ? event[0] : NULL );
                CALL_LOGGING_EXIT_EVENT( retVal, event );
                ADD_EVENT( event ? event[0] : NULL );
            }

            FINISH_OR_FLUSH_AFTER_ENQUEUE( queue );
            CHECK_AUBCAPTURE_STOP( queue );

            return retVal;
        }
    }

    NULL_FUNCTION_POINTER_RETURN_ERROR(CL_INVALID_COMMAND_QUEUE);
}